

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O2

int gen_publickey_from_rsa_evp
              (LIBSSH2_SESSION *session,uchar **method,size_t *method_len,uchar **pubkeydata,
              size_t *pubkeydata_len,EVP_PKEY *pk)

{
  ulong uVar1;
  int iVar2;
  int iVar3;
  uchar *puVar4;
  uchar *buf;
  uchar *puVar5;
  BIGNUM **ppBVar6;
  BIGNUM *local_58;
  BIGNUM *e;
  uchar **local_48;
  size_t *local_40;
  uchar **local_38;
  
  local_38 = method;
  puVar4 = (uchar *)(*session->alloc)(7,&session->abstract);
  if (puVar4 != (uchar *)0x0) {
    e = (BIGNUM *)0x0;
    local_58 = (BIGNUM *)0x0;
    local_48 = pubkeydata;
    local_40 = pubkeydata_len;
    EVP_PKEY_get_bn_param(pk,"e",&e);
    EVP_PKEY_get_bn_param(pk,"n",&local_58);
    buf = (uchar *)0x0;
    ppBVar6 = &local_58;
    if ((e != (BIGNUM *)0x0) && (ppBVar6 = &local_58, local_58 != (BIGNUM *)0x0)) {
      iVar3 = BN_num_bits((BIGNUM *)e);
      uVar1 = (long)(iVar3 + 7) / 8;
      ppBVar6 = (BIGNUM **)(uVar1 & 0xffffffff);
      iVar3 = BN_num_bits(local_58);
      iVar3 = (iVar3 + 7) / 8;
      iVar2 = (int)uVar1;
      buf = (uchar *)(*session->alloc)((long)(iVar3 + iVar2 + 0x15),&session->abstract);
      if (buf == (uchar *)0x0) {
        buf = (uchar *)0x0;
      }
      else {
        _libssh2_htonu32(buf,7);
        builtin_memcpy(buf + 4,"ssh-rsa",7);
        puVar5 = write_bn(buf + 0xb,e,iVar2 + 1);
        puVar5 = write_bn(puVar5,(BIGNUM *)local_58,iVar3 + 1);
        ppBVar6 = (BIGNUM **)(puVar5 + -(long)buf);
      }
    }
    BN_clear_free((BIGNUM *)e);
    BN_clear_free(local_58);
    if (buf != (uchar *)0x0) {
      builtin_memcpy(puVar4,"ssh-rsa",7);
      *local_38 = puVar4;
      if (method_len != (size_t *)0x0) {
        *method_len = 7;
      }
      *local_48 = buf;
      if (local_40 == (size_t *)0x0) {
        return 0;
      }
      *local_40 = (size_t)ppBVar6;
      return 0;
    }
    (*session->free)(puVar4,&session->abstract);
  }
  iVar3 = _libssh2_error(session,-6,"Unable to allocate memory for private key data");
  return iVar3;
}

Assistant:

static int
gen_publickey_from_rsa_evp(LIBSSH2_SESSION *session,
                           unsigned char **method,
                           size_t *method_len,
                           unsigned char **pubkeydata,
                           size_t *pubkeydata_len,
                           EVP_PKEY *pk)
{
    libssh2_rsa_ctx* rsa = NULL;
    unsigned char *key;
    unsigned char *method_buf = NULL;
    size_t  key_len;

    _libssh2_debug((session,
                   LIBSSH2_TRACE_AUTH,
                   "Computing public key from RSA private key envelope"));

#ifdef USE_OPENSSL_3
    rsa = pk;
#else
    rsa = EVP_PKEY_get1_RSA(pk);
#endif
    if(!rsa) {
        /* Assume memory allocation error... what else could it be ? */
        goto __alloc_error;
    }

    method_buf = LIBSSH2_ALLOC(session, 7);  /* ssh-rsa. */
    if(!method_buf) {
        goto __alloc_error;
    }

    key = gen_publickey_from_rsa(session, rsa, &key_len);
    if(!key) {
        goto __alloc_error;
    }
#ifndef USE_OPENSSL_3
    RSA_free(rsa);
#endif

    memcpy(method_buf, "ssh-rsa", 7);
    *method = method_buf;
    if(method_len) {
        *method_len = 7;
    }
    *pubkeydata = key;
    if(pubkeydata_len) {
        *pubkeydata_len = key_len;
    }
    return 0;

__alloc_error:
#ifndef USE_OPENSSL_3
    if(rsa) {
        RSA_free(rsa);
    }
#endif
    if(method_buf) {
        LIBSSH2_FREE(session, method_buf);
    }

    return _libssh2_error(session,
                          LIBSSH2_ERROR_ALLOC,
                          "Unable to allocate memory for private key data");
}